

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1ae54::SolverDpllTriadSimd<2>::CountSolutionsConsistentWithPartialAssignment
          (SolverDpllTriadSimd<2> *this,State *state)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  State *pSVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  char cVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  State state_copy;
  undefined1 local_260 [16];
  uint local_244;
  State local_240;
  
  auVar16 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[0][0].configurations.vec);
  auVar17 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[0][1].configurations.vec);
  auVar18 = vpunpcklqdq_avx(auVar16,auVar17);
  auVar16 = vpunpckhqdq_avx(auVar16,auVar17);
  auVar16 = vpaddq_avx(auVar18,auVar16);
  auVar18 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[0][2].configurations.vec);
  auVar19 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[1][0].configurations.vec);
  auVar17 = vpunpcklqdq_avx(auVar18,auVar19);
  auVar18 = vpunpckhqdq_avx(auVar18,auVar19);
  auVar18 = vpaddq_avx(auVar17,auVar18);
  auVar17 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[1][1].configurations.vec);
  auVar20 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[1][2].configurations.vec);
  auVar19 = vpunpcklqdq_avx(auVar17,auVar20);
  auVar17 = vpunpckhqdq_avx(auVar17,auVar20);
  auVar17 = vpaddq_avx(auVar19,auVar17);
  auVar19 = vpcmpeqd_avx(auVar20,auVar20);
  auVar20._8_8_ = 0xf000e00040000;
  auVar20._0_8_ = 0xf000e00040000;
  auVar19 = vpermi2w_avx512vl(auVar20,auVar16,auVar19);
  auVar16 = vpmovsxbw_avx(ZEXT816(0x70600000c080100));
  auVar18 = vpermi2w_avx512vl(auVar16,auVar19,auVar18);
  auVar16 = vpmovsxbw_avx(ZEXT816(0x7060c0803020100));
  auVar16 = vpermi2w_avx512vl(auVar16,auVar18,auVar17);
  auVar18._8_2_ = 0xfff6;
  auVar18._0_8_ = 0xfff6fff6fff6fff6;
  auVar18._10_2_ = 0xfff6;
  auVar18._12_2_ = 0xfff6;
  auVar18._14_2_ = 0xfff6;
  auVar16 = vpaddw_avx(auVar16,auVar18);
  auVar16 = vphminposuw_avx(auVar16);
  if ((auVar16 & (undefined1  [16])0xff00) == (undefined1  [16])0x0) {
    (anonymous_namespace)::SolverDpllTriadSimd<2>::CountSolutionsConsistentWithPartialAssignment();
  }
  else {
    local_244 = 0xffffffff;
    local_240.bands[0][0].configurations.vec[0] = 0;
    local_240.bands[0][0].configurations.vec[1] = 0;
  }
  if (local_244 == 0xffffffff) {
    (anonymous_namespace)::solver_enum._488_8_ = (anonymous_namespace)::solver_enum._488_8_ + 1;
    if ((anonymous_namespace)::solver_enum._504_8_ != 0) {
      lVar11 = 0;
      do {
        uVar5 = (this->solution_).boxen[0].cells.vec[lVar11];
        uVar3 = (this->solution_).boxen[0].cells.vec[lVar11 + 1];
        uVar4 = (this->solution_).boxen[0].cells.vec[lVar11 + 2];
        lVar12 = (long)*(int *)((anonymous_namespace)::tables + lVar11 + 0x18dc) * 3 +
                 (long)*(int *)((anonymous_namespace)::tables + lVar11 + 0x18b8) * 0x1b;
        cVar15 = '\0';
        for (uVar13 = (uint)uVar5; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x80000000) {
          cVar15 = cVar15 + '\x01';
        }
        cVar15 = cVar15 + '1';
        if ((uint)uVar5 == 0) {
          cVar15 = '0';
        }
        *(char *)((long)&local_240.bands[0][0].configurations + lVar12) = cVar15;
        cVar15 = '\0';
        uVar14 = (uint)(uVar5 >> 0x10);
        for (uVar13 = uVar14; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x80000000) {
          cVar15 = cVar15 + '\x01';
        }
        cVar15 = cVar15 + '1';
        if (uVar14 == 0) {
          cVar15 = '0';
        }
        *(char *)((long)&local_240.bands[0][0].configurations + lVar12 + 1) = cVar15;
        cVar15 = '\0';
        for (uVar13 = (uint)(uVar5 >> 0x20); (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x80000000) {
          cVar15 = cVar15 + '\x01';
        }
        cVar15 = cVar15 + '1';
        if (uVar5 >> 0x20 == 0) {
          cVar15 = '0';
        }
        *(char *)((long)&local_240.bands[0][0].configurations + lVar12 + 2) = cVar15;
        cVar15 = '\0';
        for (uVar13 = (uint)uVar3; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x80000000) {
          cVar15 = cVar15 + '\x01';
        }
        cVar15 = cVar15 + '1';
        if ((uint)uVar3 == 0) {
          cVar15 = '0';
        }
        *(char *)((long)&local_240.bands[0][0].eliminations + lVar12 + -7) = cVar15;
        cVar15 = '\0';
        uVar14 = (uint)(uVar3 >> 0x10);
        for (uVar13 = uVar14; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x80000000) {
          cVar15 = cVar15 + '\x01';
        }
        cVar15 = cVar15 + '1';
        if (uVar14 == 0) {
          cVar15 = '0';
        }
        *(char *)((long)&local_240.bands[0][0].eliminations + lVar12 + -6) = cVar15;
        cVar15 = '\0';
        for (uVar13 = (uint)(uVar3 >> 0x20); (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x80000000) {
          cVar15 = cVar15 + '\x01';
        }
        cVar15 = cVar15 + '1';
        if (uVar3 >> 0x20 == 0) {
          cVar15 = '0';
        }
        *(char *)((long)&local_240.bands[0][0].eliminations + lVar12 + -5) = cVar15;
        cVar15 = '\0';
        for (uVar13 = (uint)uVar4; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x80000000) {
          cVar15 = cVar15 + '\x01';
        }
        cVar15 = cVar15 + '1';
        if ((uint)uVar4 == 0) {
          cVar15 = '0';
        }
        *(char *)((long)&local_240.bands[0][0].eliminations + lVar12 + 2) = cVar15;
        cVar15 = '\0';
        uVar14 = (uint)(uVar4 >> 0x10);
        for (uVar13 = uVar14; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x80000000) {
          cVar15 = cVar15 + '\x01';
        }
        cVar15 = cVar15 + '1';
        if (uVar14 == 0) {
          cVar15 = '0';
        }
        *(char *)((long)&local_240.bands[0][0].eliminations + lVar12 + 3) = cVar15;
        cVar15 = '\0';
        for (uVar13 = (uint)(uVar4 >> 0x20); (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x80000000) {
          cVar15 = cVar15 + '\x01';
        }
        cVar15 = cVar15 + '1';
        if (uVar4 >> 0x20 == 0) {
          cVar15 = '0';
        }
        *(char *)((long)&local_240.bands[0][0].eliminations + lVar12 + 4) = cVar15;
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0x24);
      (*(code *)(anonymous_namespace)::solver_enum._504_8_)
                (&local_240,(anonymous_namespace)::solver_enum._512_8_);
    }
  }
  else {
    (anonymous_namespace)::solver_enum._496_8_ = (anonymous_namespace)::solver_enum._496_8_ + 1;
    uVar13 = *(uint *)((anonymous_namespace)::tables + (ulong)local_244 * 4 + 0x18dc);
    local_260._8_8_ = local_240.bands[0][0].configurations.vec[1];
    local_260._0_8_ = local_240.bands[0][0].configurations.vec[0];
    if (local_244 < 3) {
      auVar16 = *(undefined1 (*) [16])(this->solution_).bands[0][(int)uVar13].configurations.vec;
      bVar9 = false;
      lVar11 = 0;
      pSVar10 = &local_240;
      do {
        lVar12 = 0x10;
        do {
          puVar1 = (undefined8 *)
                   ((long)(this->solution_).bands[lVar11 + -1][2].eliminations.vec + lVar12);
          uVar7 = puVar1[1];
          puVar2 = (undefined8 *)((long)(pSVar10->bands + -1) + 0x50 + lVar12);
          *puVar2 = *puVar1;
          puVar2[1] = uVar7;
          puVar1 = (undefined8 *)
                   ((long)(this->solution_).bands[lVar11][0].configurations.vec + lVar12);
          uVar7 = puVar1[1];
          puVar2 = (undefined8 *)((long)pSVar10->bands[0][0].configurations.vec + lVar12);
          *puVar2 = *puVar1;
          puVar2[1] = uVar7;
          lVar12 = lVar12 + 0x20;
        } while (lVar12 != 0x70);
        lVar11 = 1;
        bVar8 = !bVar9;
        bVar9 = true;
        pSVar10 = (State *)(local_240.bands + 1);
      } while (bVar8);
      memcpy(local_240.boxen,(this->solution_).boxen,0x120);
      auVar16 = vpand_avx(auVar16,local_260);
      uVar5 = vpcmpgtq_avx512vl(auVar16,(undefined1  [16])0x0);
      auVar18 = vpcmpgtq_avx(auVar16,(undefined1  [16])0x0);
      auVar18 = vpslldq_avx(auVar18,1);
      auVar6._8_8_ = 1;
      auVar6._0_8_ = 1;
      auVar18 = vandnpd_avx512vl(auVar18,auVar6);
      auVar18 = vpsubq_avx512vl(auVar16,auVar18);
      bVar9 = (bool)((byte)(uVar5 & 3) & 1);
      auVar21._0_8_ = (ulong)bVar9 * auVar18._0_8_ | (ulong)!bVar9 * auVar16._0_8_;
      uVar5 = (uVar5 & 3) >> 1;
      auVar21._8_8_ = uVar5 * auVar18._8_8_ | (ulong)!SUB81(uVar5,0) * auVar16._8_8_;
      auVar18 = vpand_avx(auVar21,auVar16);
      auVar17 = vpor_avx(auVar18,*(undefined1 (*) [16])
                                  local_240.bands[0][(int)uVar13].eliminations.vec);
      *(undefined1 (*) [16])local_240.bands[0][(int)uVar13].eliminations.vec = auVar17;
      pSVar10 = (State *)(ulong)uVar13;
      bVar9 = BandEliminate<0>(&local_240,uVar13,0);
      if ((bVar9) &&
         (CountSolutionsConsistentWithPartialAssignment
                    ((SolverDpllTriadSimd<2> *)&local_240,pSVar10),
         (anonymous_namespace)::solver_enum._488_8_ == (anonymous_namespace)::solver_enum._480_8_))
      {
        return;
      }
      auVar16 = vpternlogq_avx512vl(auVar16,auVar18,
                                    *(undefined1 (*) [16])
                                     (this->solution_).bands[0][(int)uVar13].eliminations.vec,0xbe);
      *(undefined1 (*) [16])(this->solution_).bands[0][(int)uVar13].eliminations.vec = auVar16;
      pSVar10 = (State *)(ulong)uVar13;
      bVar9 = BandEliminate<0>(&this->solution_,uVar13,0);
    }
    else {
      auVar16 = *(undefined1 (*) [16])(this->solution_).boxen[(long)(int)uVar13 + -3].cells.vec;
      bVar9 = false;
      lVar11 = 0;
      pSVar10 = &local_240;
      do {
        lVar12 = 0x10;
        do {
          puVar1 = (undefined8 *)
                   ((long)(this->solution_).bands[lVar11 + -1][2].eliminations.vec + lVar12);
          uVar7 = puVar1[1];
          puVar2 = (undefined8 *)((long)(pSVar10->bands + -1) + 0x50 + lVar12);
          *puVar2 = *puVar1;
          puVar2[1] = uVar7;
          puVar1 = (undefined8 *)
                   ((long)(this->solution_).bands[lVar11][0].configurations.vec + lVar12);
          uVar7 = puVar1[1];
          puVar2 = (undefined8 *)((long)pSVar10->bands[0][0].configurations.vec + lVar12);
          *puVar2 = *puVar1;
          puVar2[1] = uVar7;
          lVar12 = lVar12 + 0x20;
        } while (lVar12 != 0x70);
        lVar11 = 1;
        bVar8 = !bVar9;
        bVar9 = true;
        pSVar10 = (State *)(local_240.bands + 1);
      } while (bVar8);
      memcpy(local_240.boxen,(this->solution_).boxen,0x120);
      auVar16 = vpand_avx(auVar16,local_260);
      uVar5 = vpcmpgtq_avx512vl(auVar16,(undefined1  [16])0x0);
      auVar18 = vpcmpgtq_avx(auVar16,(undefined1  [16])0x0);
      auVar18 = vpslldq_avx(auVar18,1);
      auVar17._8_8_ = 1;
      auVar17._0_8_ = 1;
      auVar18 = vandnpd_avx512vl(auVar18,auVar17);
      auVar18 = vpsubq_avx512vl(auVar16,auVar18);
      bVar9 = (bool)((byte)(uVar5 & 3) & 1);
      auVar19._0_8_ = (ulong)bVar9 * auVar18._0_8_ | (ulong)!bVar9 * auVar16._0_8_;
      uVar5 = (uVar5 & 3) >> 1;
      auVar19._8_8_ = uVar5 * auVar18._8_8_ | (ulong)!SUB81(uVar5,0) * auVar16._8_8_;
      auVar18 = vpand_avx(auVar19,auVar16);
      auVar17 = vpor_avx(auVar18,*(undefined1 (*) [16])
                                  (local_240.boxen[(long)(int)uVar13 + -3].cells.vec + 2));
      *(undefined1 (*) [16])(local_240.boxen[(long)(int)uVar13 + -3].cells.vec + 2) = auVar17;
      pSVar10 = (State *)(ulong)uVar13;
      bVar9 = BandEliminate<1>(&local_240,uVar13,0);
      if ((bVar9) &&
         (CountSolutionsConsistentWithPartialAssignment
                    ((SolverDpllTriadSimd<2> *)&local_240,pSVar10),
         (anonymous_namespace)::solver_enum._488_8_ == (anonymous_namespace)::solver_enum._480_8_))
      {
        return;
      }
      auVar16 = vpternlogq_avx512vl(auVar16,auVar18,
                                    *(undefined1 (*) [16])
                                     ((this->solution_).boxen[(long)(int)uVar13 + -3].cells.vec + 2)
                                    ,0xbe);
      *(undefined1 (*) [16])((this->solution_).boxen[(long)(int)uVar13 + -3].cells.vec + 2) =
           auVar16;
      pSVar10 = (State *)(ulong)uVar13;
      bVar9 = BandEliminate<1>(&this->solution_,uVar13,0);
    }
    if (bVar9 != false) {
      CountSolutionsConsistentWithPartialAssignment(this,pSVar10);
    }
  }
  return;
}

Assistant:

void CountSolutionsConsistentWithPartialAssignment(State &state) {
        auto band_and_value = ChooseBandAndValueToBranch(state);
        if (band_and_value.first == NONE) {
            num_solutions_++;
            if (solution_mode == 1 && num_solutions_ == limit_) solution_ = state;
            if (solution_mode == 2) ReportSolution(state);
        } else {
            if (band_and_value.first < 3) {
                BranchOnBandAndValue<0>(
                        tables.mod3[band_and_value.first], band_and_value.second, state);
            } else {
                BranchOnBandAndValue<1>(
                        tables.mod3[band_and_value.first], band_and_value.second, state);
            }
        }
    }